

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBInterpolater.cpp
# Opt level: O0

void __thiscall
amrex::EBCellConservativeLinear::interp
          (EBCellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,
          Geometry *fine_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int actual_comp,int actual_state,RunOn runon)

{
  FabType FVar1;
  EBFArrayBox *in_RCX;
  EBFArrayBox *in_RSI;
  long *in_RDI;
  int in_R8D;
  Box *in_stack_00000008;
  Box *in_stack_00000010;
  char *in_stack_00000020;
  Array4<const_double> *ca;
  Array4<double> *fa;
  Array4<const_amrex::EBCellFlag> *cflag;
  FabType ctype;
  FabType ftype;
  Box *crse_bx;
  EBCellFlagFab *fine_flag;
  EBCellFlagFab *crse_flag;
  EBFArrayBox *fine_eb;
  EBFArrayBox *crse_eb;
  Box *target_fine_region;
  Box *in_stack_00000300;
  IntVect *in_stack_00000308;
  Geometry *in_stack_00000310;
  Geometry *in_stack_00000318;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000320;
  int in_stack_00000328;
  int in_stack_00000330;
  RunOn in_stack_00000338;
  Box *pBVar2;
  anon_class_224_6_7c292315 *f;
  Array4<double> *this_00;
  int ncomp_00;
  undefined1 auStack_580 [64];
  undefined1 auStack_540 [64];
  int local_500;
  undefined1 auStack_4f8 [24];
  Box *in_stack_fffffffffffffb20;
  EBCellFlagFab *in_stack_fffffffffffffb28;
  Array4<const_double> local_4b0;
  Array4<const_double> *local_470;
  Array4<double> local_468;
  Array4<double> *local_428;
  undefined1 local_420 [76];
  FabType local_3d4;
  FabType local_3d0;
  undefined1 local_3cc [28];
  undefined1 *local_3b0;
  EBCellFlagFab *local_3a8;
  EBCellFlagFab *local_3a0;
  EBFArrayBox *local_398;
  EBFArrayBox *local_390;
  Box local_384;
  Box *local_368;
  int local_35c;
  EBFArrayBox *local_358;
  EBFArrayBox *local_348;
  char *local_338;
  EBCellFlagFab *local_330;
  EBFArrayBox *local_328;
  EBFArrayBox *local_320;
  undefined1 *local_318;
  Dim3 local_310;
  Dim3 local_300;
  Dim3 local_2f0;
  Dim3 local_2e0;
  int local_2d4;
  Box *local_2d0;
  EBCellFlag *local_2c8;
  Dim3 local_2c0;
  Box *local_2b0;
  int local_2a4;
  int iStack_2a0;
  int local_29c;
  Dim3 local_298;
  Box *local_288;
  int local_280;
  int iStack_27c;
  int local_278;
  undefined4 local_274;
  IntVect *local_270;
  undefined4 local_264;
  IntVect *local_260;
  undefined4 local_254;
  IntVect *local_250;
  undefined4 local_244;
  Box *local_240;
  undefined4 local_234;
  Box *local_230;
  undefined4 local_224;
  Box *local_220;
  Dim3 local_218;
  Dim3 local_208;
  Dim3 local_1f8;
  Dim3 local_1e8;
  int local_1dc;
  Box *local_1d8;
  double *local_1d0;
  Dim3 local_1c8;
  Box *local_1b8;
  int local_1ac;
  int iStack_1a8;
  int local_1a4;
  Dim3 local_1a0;
  Box *local_190;
  int local_188;
  int iStack_184;
  int local_180;
  undefined4 local_17c;
  IntVect *local_178;
  undefined4 local_16c;
  IntVect *local_168;
  undefined4 local_15c;
  IntVect *local_158;
  undefined4 local_14c;
  Box *local_148;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  FArrayBox *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  FArrayBox *in_stack_fffffffffffffed8;
  CellConservativeLinear *in_stack_fffffffffffffee0;
  Dim3 local_10c;
  Dim3 local_100;
  Dim3 local_f0;
  int local_e4;
  Box *local_e0;
  double *local_d8;
  Dim3 local_d0;
  Box *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  Dim3 local_a8;
  Box *local_98;
  int local_90;
  int iStack_8c;
  int local_88;
  undefined4 local_84;
  IntVect *local_80;
  undefined4 local_74;
  IntVect *local_70;
  undefined4 local_64;
  IntVect *local_60;
  undefined4 local_54;
  Box *local_50;
  undefined4 local_44;
  Box *local_40;
  undefined4 local_34;
  Box *local_30;
  
  pBVar2 = in_stack_00000010;
  local_35c = in_R8D;
  local_358 = in_RCX;
  local_348 = in_RSI;
  amrex::CellConservativeLinear::interp
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
             in_stack_00000300,in_stack_00000308,in_stack_00000310,in_stack_00000318,
             in_stack_00000320,in_stack_00000328,in_stack_00000330,in_stack_00000338);
  BaseFab<double>::box((BaseFab<double> *)local_358);
  Box::operator&(pBVar2,in_stack_00000008);
  local_368 = &local_384;
  FVar1 = FArrayBox::getType(&local_348->super_FArrayBox);
  if (FVar1 != regular) {
    local_390 = local_348;
    local_398 = local_358;
    local_3a0 = EBFArrayBox::getEBCellFlagFab(local_348);
    local_3a8 = EBFArrayBox::getEBCellFlagFab(local_398);
    (**(code **)(*in_RDI + 0x18))(local_3cc,in_RDI,local_368,in_stack_00000010);
    local_3b0 = local_3cc;
    local_3d0 = EBCellFlagFab::getType(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    local_3d4 = EBCellFlagFab::getType(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    if ((local_3d0 == multivalued) || (local_3d4 == multivalued)) {
      local_338 = "EBCellConservativeLinear::interp: multivalued not implemented";
      Abort_host(in_stack_00000020);
    }
    else if (local_3d0 != covered) {
      local_330 = local_3a0;
      local_2c8 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_2d0 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain;
      local_2d4 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_224 = 0;
      local_2a4 = (local_2d0->smallend).vect[0];
      local_234 = 1;
      iStack_2a0 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_2f0.x = (local_2d0->smallend).vect[0];
      local_2f0.y = (local_2d0->smallend).vect[1];
      local_244 = 2;
      local_2f0.z = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_250 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_254 = 0;
      local_280 = local_250->vect[0] + 1;
      local_260 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_264 = 1;
      iStack_27c = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      local_270 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_274 = 2;
      local_310.z = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_310.y = iStack_27c;
      local_310.x = local_280;
      f = (anon_class_224_6_7c292315 *)local_420;
      local_300._0_8_ = local_310._0_8_;
      local_300.z = local_310.z;
      local_2e0._0_8_ = local_2f0._0_8_;
      local_2e0.z = local_2f0.z;
      local_2c0._0_8_ = local_2f0._0_8_;
      local_2c0.z = local_2f0.z;
      local_2b0 = local_2d0;
      local_29c = local_2f0.z;
      local_298._0_8_ = local_310._0_8_;
      local_298.z = local_310.z;
      local_288 = local_2d0;
      local_278 = local_310.z;
      local_240 = local_2d0;
      local_230 = local_2d0;
      local_220 = local_2d0;
      Array4<const_amrex::EBCellFlag>::Array4
                ((Array4<const_amrex::EBCellFlag> *)f,local_2c8,&local_2e0,&local_300,local_2d4);
      local_328 = local_358;
      local_1d0 = (local_358->super_FArrayBox).super_BaseFab<double>.dptr;
      local_1d8 = &(local_358->super_FArrayBox).super_BaseFab<double>.domain;
      local_1dc = (local_358->super_FArrayBox).super_BaseFab<double>.nvar;
      local_1ac = (local_1d8->smallend).vect[0];
      iStack_1a8 = (local_358->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1];
      local_1f8.x = (local_1d8->smallend).vect[0];
      local_1f8.y = (local_1d8->smallend).vect[1];
      local_14c = 2;
      local_1f8.z = (local_358->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2];
      local_158 = &(local_358->super_FArrayBox).super_BaseFab<double>.domain.bigend;
      local_15c = 0;
      local_188 = local_158->vect[0] + 1;
      local_168 = &(local_358->super_FArrayBox).super_BaseFab<double>.domain.bigend;
      local_16c = 1;
      iStack_184 = (local_358->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] + 1;
      local_178 = &(local_358->super_FArrayBox).super_BaseFab<double>.domain.bigend;
      local_17c = 2;
      local_218.z = (local_358->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] + 1;
      local_218.y = iStack_184;
      local_218.x = local_188;
      this_00 = &local_468;
      local_420._64_8_ = f;
      local_208._0_8_ = local_218._0_8_;
      local_208.z = local_218.z;
      local_1e8._0_8_ = local_1f8._0_8_;
      local_1e8.z = local_1f8.z;
      local_1c8._0_8_ = local_1f8._0_8_;
      local_1c8.z = local_1f8.z;
      local_1b8 = local_1d8;
      local_1a4 = local_1f8.z;
      local_1a0._0_8_ = local_218._0_8_;
      local_1a0.z = local_218.z;
      local_190 = local_1d8;
      local_180 = local_218.z;
      local_148 = local_1d8;
      Array4<double>::Array4(this_00,local_1d0,&local_1e8,&local_208,local_1dc);
      local_320 = local_348;
      local_d8 = (local_348->super_FArrayBox).super_BaseFab<double>.dptr;
      local_e0 = &(local_348->super_FArrayBox).super_BaseFab<double>.domain;
      local_e4 = (local_348->super_FArrayBox).super_BaseFab<double>.nvar;
      local_34 = 0;
      local_b4 = (local_e0->smallend).vect[0];
      local_44 = 1;
      iStack_b0 = (local_348->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1];
      local_100.x = (local_e0->smallend).vect[0];
      local_100.y = (local_e0->smallend).vect[1];
      local_54 = 2;
      local_100.z = (local_348->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2];
      local_60 = &(local_348->super_FArrayBox).super_BaseFab<double>.domain.bigend;
      local_64 = 0;
      local_90 = local_60->vect[0] + 1;
      local_70 = &(local_348->super_FArrayBox).super_BaseFab<double>.domain.bigend;
      local_74 = 1;
      iStack_8c = (local_348->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] + 1;
      local_80 = &(local_348->super_FArrayBox).super_BaseFab<double>.domain.bigend;
      local_84 = 2;
      local_10c.z = (local_348->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] + 1;
      local_10c.y = iStack_8c;
      local_10c.x = local_90;
      local_428 = this_00;
      local_f0._0_8_ = local_100._0_8_;
      local_f0.z = local_100.z;
      local_d0._0_8_ = local_100._0_8_;
      local_d0.z = local_100.z;
      local_c0 = local_e0;
      local_ac = local_100.z;
      local_a8._0_8_ = local_10c._0_8_;
      local_a8.z = local_10c.z;
      local_98 = local_e0;
      local_88 = local_10c.z;
      local_50 = local_e0;
      local_40 = local_e0;
      local_30 = local_e0;
      Array4<const_double>::Array4(&local_4b0,local_d8,&local_f0,&local_10c,local_e4);
      ncomp_00 = (int)((ulong)this_00 >> 0x20);
      local_470 = &local_4b0;
      local_318 = &stack0x00000040;
      pBVar2 = local_368;
      memcpy(auStack_580,(void *)local_420._64_8_,0x3c);
      memcpy(auStack_540,local_428,0x3c);
      local_500 = local_35c;
      memcpy(auStack_4f8,local_470,0x3c);
      LoopOnCpu<amrex::EBCellConservativeLinear::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__0>
                (pBVar2,ncomp_00,f);
    }
  }
  return;
}

Assistant:

void
EBCellConservativeLinear::interp (const FArrayBox& crse,
                                  int              crse_comp,
                                  FArrayBox&       fine,
                                  int              fine_comp,
                                  int              ncomp,
                                  const Box&       fine_region,
                                  const IntVect&   ratio,
                                  const Geometry&  crse_geom,
                                  const Geometry&  fine_geom,
                                  Vector<BCRec> const&  bcr,
                                  int              actual_comp,
                                  int              actual_state,
                                  RunOn            runon)
{
    CellConservativeLinear::interp(crse, crse_comp, fine, fine_comp, ncomp, fine_region, ratio,
                                   crse_geom, fine_geom, bcr, actual_comp, actual_state, runon);

    const Box& target_fine_region = fine_region & fine.box();

    if (crse.getType() == FabType::regular)
    {
        BL_ASSERT(amrex::getEBCellFlagFab(fine).getType(target_fine_region) == FabType::regular);
    }
    else
    {
        const EBFArrayBox& crse_eb = static_cast<EBFArrayBox const&>(crse);
        EBFArrayBox&       fine_eb = static_cast<EBFArrayBox      &>(fine);

        const EBCellFlagFab& crse_flag = crse_eb.getEBCellFlagFab();
        const EBCellFlagFab& fine_flag = fine_eb.getEBCellFlagFab();

        const Box& crse_bx = CoarseBox(target_fine_region,ratio);

        const FabType ftype = fine_flag.getType(target_fine_region);
        const FabType ctype = crse_flag.getType(crse_bx);

        if (ftype == FabType::multivalued || ctype == FabType::multivalued)
        {
            amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
        }
        else if (ftype == FabType::covered)
        {
            ; // don't need to do anything special
        }
        else
        {
            const auto& cflag = crse_flag.const_array();
            auto const& fa = fine.array();
            auto const& ca = crse.const_array();
            AMREX_HOST_DEVICE_FOR_4D_FLAG(runon, target_fine_region, ncomp, i, j, k, n,
            {
                Dim3 cxyz = amrex::coarsen(Dim3{i,j,k}, ratio);
                if (cflag(cxyz.x,cxyz.y,cxyz.z).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fa(i,j,k,n+fine_comp) = ca(cxyz.x,cxyz.y,cxyz.z,n+crse_comp);
                }
            });
        }
    }
}